

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O1

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  void *pvVar10;
  pointer piVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 extraout_var;
  void *pvVar15;
  undefined4 extraout_var_00;
  undefined4 in_ECX;
  int iVar16;
  int *piVar17;
  ulong uVar18;
  int iVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  void *pvVar29;
  uint uVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  uint uVar35;
  undefined1 auVar34 [16];
  void *ptr;
  undefined8 uStack_150;
  undefined4 uStack_148;
  undefined4 uStack_144;
  int local_140;
  Allocator *local_138;
  int iStack_130;
  uint uStack_12c;
  int iStack_128;
  uint uStack_124;
  undefined8 uStack_120;
  ulong local_110;
  allocator_type local_101;
  Option *local_100;
  undefined1 local_f8 [16];
  ulong local_e8;
  ulong local_e0;
  undefined1 local_d8 [16];
  Mat local_c8;
  ulong local_88;
  long local_80;
  void *local_78;
  long local_70;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar23 = bottom_top_blob->w;
  uVar22._0_4_ = bottom_top_blob->h;
  uVar22._4_4_ = bottom_top_blob->c;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar22;
  uVar18 = bottom_top_blob->elemsize;
  uVar27 = (undefined4)uVar22 * uVar23;
  local_c8.allocator = opt->workspace_allocator;
  auVar5._4_4_ = -(uint)((undefined4)uVar22 == 0);
  auVar5._0_4_ = -(uint)(uVar23 == 0);
  auVar5._8_4_ = -(uint)(uVar22._4_4_ == 0);
  auVar5._12_4_ = 0;
  movmskps(in_ECX,auVar5 << 0x20);
  local_c8.elemsize._0_4_ = (undefined4)uVar18;
  uVar8 = (undefined4)local_c8.elemsize;
  local_c8.elemsize._4_4_ = (undefined4)(uVar18 >> 0x20);
  uVar9 = local_c8.elemsize._4_4_;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.packing = 1;
  local_c8.dims = 3;
  local_c8.cstep = ((long)(int)uVar27 * uVar18 + 0xf & 0xfffffffffffffff0) / uVar18;
  piVar17 = (int *)(ulong)(uint)uVar22._4_4_;
  local_100 = opt;
  local_e8 = uVar22;
  local_c8.w = uVar23;
  local_c8.h = (undefined4)uVar22;
  local_c8.c = uVar22._4_4_;
  uVar30 = uVar23;
  local_c8.refcount = (int *)0x0;
  if ((long)(int)uVar22._4_4_ * local_c8.cstep != 0) {
    uVar21 = (long)(int)uVar22._4_4_ * local_c8.cstep * uVar18 + 3 & 0xfffffffffffffffc;
    local_f8 = ZEXT416(uVar23);
    local_d8 = auVar34;
    if (local_c8.allocator == (Allocator *)0x0) {
      ptr = (void *)0x0;
      iVar12 = posix_memalign(&ptr,0x10,uVar21 + 4);
      if (iVar12 != 0) {
        ptr = (void *)0x0;
      }
      local_c8.data = ptr;
      uVar22 = local_d8._0_8_;
      uVar30 = local_f8._0_4_;
    }
    else {
      iVar12 = (*(local_c8.allocator)->_vptr_Allocator[2])(local_c8.allocator);
      local_c8.data = (void *)CONCAT44(extraout_var,iVar12);
      uVar22 = local_d8._0_8_;
      uVar30 = local_f8._0_4_;
    }
    piVar17 = (int *)((long)local_c8.data + uVar21);
    *(undefined4 *)((long)local_c8.data + uVar21) = 1;
    local_c8.refcount = piVar17;
  }
  iVar12 = -100;
  if ((local_c8.data == (void *)0x0) || ((long)local_c8.c * local_c8.cstep == 0)) goto LAB_0013701c;
  uVar35 = (uint)(uVar22 >> 0x20);
  if (0 < (int)uVar35) {
    pvVar15 = bottom_top_blob->data;
    piVar17 = (int *)(bottom_top_blob->cstep * bottom_top_blob->elemsize);
    uVar21 = 0;
    pvVar20 = local_c8.data;
    do {
      if (0 < (int)uVar27) {
        uVar28 = 0;
        do {
          fVar32 = *(float *)((long)pvVar15 + uVar28 * 4);
          *(float *)((long)pvVar20 + uVar28 * 4) = fVar32 * fVar32;
          uVar28 = uVar28 + 1;
        } while (uVar27 != uVar28);
      }
      uVar21 = uVar21 + 1;
      pvVar20 = (void *)((long)pvVar20 +
                        local_c8.cstep *
                        CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
      pvVar15 = (void *)((long)pvVar15 + (long)piVar17);
    } while (uVar21 != uVar35);
  }
  local_d8._0_8_ = this;
  local_110 = CONCAT44(local_110._4_4_,uVar35);
  if (this->region_type == 0) {
    local_138 = local_100->workspace_allocator;
    auVar6._4_4_ = -(uint)((int)uVar22 == 0);
    auVar6._0_4_ = -(uint)(uVar30 == 0);
    auVar6._8_4_ = -(uint)(uVar35 == 0);
    auVar6._12_4_ = 0;
    movmskps((int)piVar17,auVar6 << 0x20);
    ptr = (void *)0x0;
    uStack_150._0_4_ = 0;
    uStack_150._4_4_ = 0;
    uStack_150 = (int *)0x0;
    local_140 = 1;
    iStack_130 = 3;
    iStack_128 = (int)local_e8;
    uStack_120 = ((long)(int)uVar27 * uVar18 + 0xf & 0xfffffffffffffff0) / uVar18;
    uStack_148 = uVar8;
    uStack_144 = uVar9;
    uStack_12c = uVar23;
    uStack_124 = uVar35;
    if ((long)(int)uVar35 * uStack_120 != 0) {
      uVar22 = (long)(int)uVar35 * uStack_120 * uVar18 + 3 & 0xfffffffffffffffc;
      if (local_138 == (Allocator *)0x0) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        iVar14 = posix_memalign((void **)&_space_ofs,0x10,uVar22 + 4);
        ptr = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
        if (iVar14 != 0) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          ptr = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
        }
      }
      else {
        iVar14 = (*local_138->_vptr_Allocator[2])(local_138);
        ptr = (pointer)CONCAT44(extraout_var_00,iVar14);
      }
      uStack_150 = (int *)((long)ptr + uVar22);
      *(undefined4 *)((long)ptr + uVar22) = 1;
    }
    bVar31 = ptr == (void *)0x0 || (long)(int)uStack_124 * uStack_120 == 0;
    if (bVar31) {
      if (uStack_150 != (int *)0x0) {
        LOCK();
        *uStack_150 = *uStack_150 + -1;
        UNLOCK();
        if (*uStack_150 == 0) {
          if (local_138 == (Allocator *)0x0) {
            if (ptr != (void *)0x0) {
              free(ptr);
            }
          }
          else {
            (*local_138->_vptr_Allocator[3])();
          }
        }
      }
      uStack_148 = 0;
      uStack_144 = 0;
      local_140 = 0;
      ptr = (void *)0x0;
      uStack_150._0_4_ = 0;
      uStack_150._4_4_ = 0;
      iStack_130 = 0;
      uStack_12c = 0;
      iStack_128 = 0;
      uStack_124 = 0;
      uStack_120._0_4_ = 0;
      uStack_120._4_4_ = 0;
      goto LAB_0013701c;
    }
    local_88 = CONCAT71(local_88._1_7_,bVar31);
    if (0 < (int)(uStack_124 * (int)uStack_120)) {
      memset(ptr,0,(ulong)(uStack_124 * (int)uStack_120) << 2);
    }
    if (0 < (int)(uint)local_110) {
      uVar7 = local_d8._0_8_;
      fVar32 = *(float *)(local_d8._0_8_ + 0x88);
      uVar23 = *(int *)(local_d8._0_8_ + 0x84) / 2;
      local_78 = (void *)(ulong)-uVar23;
      pvVar15 = bottom_top_blob->data;
      local_e0 = (ulong)(int)uVar23;
      local_e8 = local_110 & 0xffffffff;
      fVar33 = 1.0 / (float)*(int *)(local_d8._0_8_ + 0x84);
      local_70 = uStack_120 * CONCAT44(uStack_144,uStack_148);
      local_80 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      uVar22 = 0;
      local_100 = (Option *)CONCAT44(local_100._4_4_,fVar33);
      pvVar20 = ptr;
      do {
        uVar30 = (int)local_78 + (int)uVar22;
        local_f8._0_8_ = uVar22;
        if ((long)(int)uVar30 <= (long)(local_e0 + uVar22)) {
          do {
            if ((uVar30 < (uint)local_110) && (0 < (int)uVar27)) {
              uVar22 = 0;
              do {
                *(float *)((long)pvVar20 + uVar22 * 4) =
                     *(float *)((long)pvVar20 + uVar22 * 4) +
                     *(float *)((long)local_c8.data +
                               uVar22 * 4 +
                               (ulong)uVar30 *
                               local_c8.cstep *
                               CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
                uVar22 = uVar22 + 1;
              } while (uVar27 != uVar22);
            }
            bVar31 = uVar30 != uVar23;
            uVar30 = uVar30 + 1;
          } while (bVar31);
        }
        if (0 < (int)uVar27) {
          uVar22 = 0;
          do {
            fVar33 = powf(*(float *)((long)pvVar20 + uVar22 * 4) * fVar32 * fVar33 +
                          *(float *)(uVar7 + 0x90),-*(float *)(uVar7 + 0x8c));
            *(float *)((long)pvVar15 + uVar22 * 4) = fVar33 * *(float *)((long)pvVar15 + uVar22 * 4)
            ;
            uVar22 = uVar22 + 1;
            fVar33 = local_100._0_4_;
          } while (uVar27 != uVar22);
        }
        uVar23 = uVar23 + 1;
        uVar22 = local_f8._0_8_ + 1;
        pvVar20 = (void *)((long)pvVar20 + local_70);
        pvVar15 = (void *)((long)pvVar15 + local_80);
      } while (uVar22 != local_e8);
    }
    iVar12 = -100;
    if (uStack_150 != (int *)0x0) {
      LOCK();
      *uStack_150 = *uStack_150 + -1;
      UNLOCK();
      if (*uStack_150 == 0) {
        if (local_138 == (Allocator *)0x0) {
          if (ptr != (void *)0x0) {
            free(ptr);
          }
        }
        else {
          (*local_138->_vptr_Allocator[3])();
        }
      }
    }
    uStack_148 = 0;
    uStack_144 = 0;
    local_140 = 0;
    ptr = (void *)0x0;
    uStack_150._0_4_ = 0;
    uStack_150._4_4_ = 0;
    iStack_130 = 0;
    uStack_12c = 0;
    iStack_128 = 0;
    uStack_124 = 0;
    uStack_120._0_4_ = 0;
    uStack_120._4_4_ = 0;
    if ((char)local_88 != '\0') goto LAB_0013701c;
  }
  else if (this->region_type == 1) {
    ptr = local_c8.data;
    uStack_148 = (undefined4)local_c8.elemsize;
    uStack_144 = local_c8.elemsize._4_4_;
    local_140 = local_c8.packing;
    local_138 = local_c8.allocator;
    iStack_130 = local_c8.dims;
    uStack_12c = local_c8.w;
    iStack_128 = local_c8.h;
    uStack_124 = local_c8.c;
    uStack_120._0_4_ = (int)local_c8.cstep;
    uStack_120._4_4_ = (undefined4)(local_c8.cstep >> 0x20);
    if (local_c8.refcount != (int *)0x0) {
      LOCK();
      *local_c8.refcount = *local_c8.refcount + 1;
      UNLOCK();
    }
    uVar30 = this->local_size;
    uVar27 = uVar23;
    uStack_150 = local_c8.refcount;
    if (1 < (int)uVar30) {
      uVar27 = uVar30 >> 1;
      copy_make_border(&local_c8,(Mat *)&ptr,uVar27,~uVar27 + uVar30,uVar27,~uVar27 + uVar30,0,0.0,
                       local_100->workspace_allocator,local_100->num_threads);
      iVar12 = -100;
      if ((ptr == (void *)0x0) ||
         (uVar27 = uStack_12c,
         (long)(int)uStack_124 * CONCAT44(uStack_120._4_4_,(int)uStack_120) == 0)) {
        if (uStack_150 != (int *)0x0) {
          LOCK();
          *uStack_150 = *uStack_150 + -1;
          UNLOCK();
          if (*uStack_150 == 0) {
            if (local_138 == (Allocator *)0x0) {
              if (ptr != (void *)0x0) {
                free(ptr);
              }
            }
            else {
              (*local_138->_vptr_Allocator[3])();
            }
          }
        }
        uStack_148 = 0;
        uStack_144 = 0;
        local_140 = 0;
        ptr = (void *)0x0;
        uStack_150._0_4_ = 0;
        uStack_150._4_4_ = 0;
        iStack_130 = 0;
        uStack_12c = 0;
        iStack_128 = 0;
        uStack_124 = 0;
        uStack_120._0_4_ = 0;
        uStack_120._4_4_ = 0;
        goto LAB_0013701c;
      }
    }
    iVar12 = this->local_size;
    uVar30 = iVar12 * iVar12;
    local_100 = (Option *)CONCAT44(local_100._4_4_,this->alpha);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar30,&local_101);
    piVar11 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar15 = ptr;
    iVar14 = this->local_size;
    if (0 < iVar14) {
      iVar13 = 0;
      iVar16 = 0;
      iVar19 = 0;
      do {
        if (0 < this->local_size) {
          lVar26 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar19 + lVar26] = iVar16 + (int)lVar26;
            lVar26 = lVar26 + 1;
            iVar25 = (int)lVar26;
          } while (iVar25 < this->local_size);
          iVar19 = iVar19 + iVar25;
          iVar16 = iVar16 + iVar25;
        }
        iVar16 = iVar16 + (uVar27 - iVar14);
        iVar13 = iVar13 + 1;
      } while (iVar13 < this->local_size);
    }
    if (0 < (int)(uint)local_110) {
      local_70 = (long)(int)uVar23;
      sVar1 = bottom_top_blob->cstep;
      sVar2 = bottom_top_blob->elemsize;
      pvVar20 = bottom_top_blob->data;
      lVar26 = CONCAT44(uStack_144,uStack_148);
      lVar3 = CONCAT44(uStack_120._4_4_,(int)uStack_120);
      local_88 = local_110 & 0xffffffff;
      local_110 = local_e8 & 0xffffffff;
      local_80 = (int)uStack_12c * lVar26;
      local_e0 = 0;
      do {
        if (0 < (int)local_e8) {
          local_78 = (void *)(lVar3 * lVar26 * local_e0 + (long)pvVar15);
          pvVar29 = (void *)(sVar1 * sVar2 * local_e0 + (long)pvVar20);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_f8._8_8_;
          local_f8 = auVar4 << 0x40;
          do {
            pvVar10 = local_78;
            if (0 < (int)uVar23) {
              lVar24 = local_f8._0_8_ * local_80;
              uVar22 = 0;
              do {
                if (iVar12 == 0) {
                  fVar32 = 0.0;
                }
                else {
                  fVar32 = 0.0;
                  uVar18 = 0;
                  do {
                    fVar32 = fVar32 + *(float *)((long)pvVar10 +
                                                (long)piVar11[uVar18] * 4 + uVar22 * 4 + lVar24);
                    uVar18 = uVar18 + 1;
                  } while (uVar30 + (uVar30 == 0) != uVar18);
                }
                fVar32 = powf(fVar32 * local_100._0_4_ * (1.0 / (float)(int)uVar30) +
                              *(float *)(local_d8._0_8_ + 0x90),-*(float *)(local_d8._0_8_ + 0x8c));
                *(float *)((long)pvVar29 + uVar22 * 4) =
                     fVar32 * *(float *)((long)pvVar29 + uVar22 * 4);
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar23);
            }
            pvVar29 = (void *)((long)pvVar29 + local_70 * 4);
            uVar22 = local_f8._0_8_ + 1;
            local_f8._0_8_ = uVar22;
          } while (uVar22 != local_110);
        }
        local_e0 = local_e0 + 1;
      } while (local_e0 != local_88);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (uStack_150 != (int *)0x0) {
      LOCK();
      *uStack_150 = *uStack_150 + -1;
      UNLOCK();
      if (*uStack_150 == 0) {
        if (local_138 == (Allocator *)0x0) {
          if (ptr != (void *)0x0) {
            free(ptr);
          }
        }
        else {
          (*local_138->_vptr_Allocator[3])();
        }
      }
    }
    uStack_148 = 0;
    uStack_144 = 0;
    local_140 = 0;
    ptr = (void *)0x0;
    uStack_150._0_4_ = 0;
    uStack_150._4_4_ = 0;
    iStack_130 = 0;
    uStack_12c = 0;
    iStack_128 = 0;
    uStack_124 = 0;
    uStack_120._0_4_ = 0;
    uStack_120._4_4_ = 0;
  }
  iVar12 = 0;
LAB_0013701c:
  if (local_c8.refcount != (int *)0x0) {
    LOCK();
    *local_c8.refcount = *local_c8.refcount + -1;
    UNLOCK();
    if (*local_c8.refcount == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar12;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p=q - local_size / 2; p<=q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i=0; i<size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}